

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_invert_mod2(poly *out,poly *in)

{
  int iVar1;
  crypto_word_t cVar2;
  crypto_word_t cVar3;
  ulong mask_00;
  crypto_word_t c;
  crypto_word_t mask;
  crypto_word_t g_has_constant_term;
  crypto_word_t delta_is_non_zero;
  crypto_word_t delta_is_non_negative;
  crypto_word_t delta_sign_bit;
  size_t i;
  undefined1 auStack_178 [4];
  int delta;
  poly2 g;
  poly2 f;
  poly2 r;
  poly2 v;
  poly *in_local;
  poly *out_local;
  
  poly2_zero((poly2 *)(r.v + 10));
  poly2_zero((poly2 *)(f.v + 10));
  f.v[10] = 1;
  OPENSSL_memset(g.v + 10,0xff,0x58);
  f.v[9] = f.v[9] >> 3;
  poly2_from_poly((poly2 *)auStack_178,in);
  poly2_mod_phiN((poly2 *)auStack_178);
  poly2_reverse_700((poly2 *)auStack_178,(poly2 *)auStack_178);
  i._4_4_ = 1;
  for (delta_sign_bit = 0; delta_sign_bit < 0x577; delta_sign_bit = delta_sign_bit + 1) {
    poly2_lshift1((poly2 *)(r.v + 10));
    cVar2 = constant_time_is_zero_w((long)i._4_4_);
    cVar3 = lsb_to_all(_auStack_178);
    mask_00 = cVar3 & (long)(int)(i._4_4_ >> 0x1f & 1) - 1U & (cVar2 ^ 0xffffffffffffffff);
    cVar2 = lsb_to_all(g.v[10] & _auStack_178);
    iVar1 = constant_time_select_int(mask_00,-i._4_4_,i._4_4_);
    i._4_4_ = iVar1 + 1;
    poly2_cswap((poly2 *)(g.v + 10),(poly2 *)auStack_178,mask_00);
    poly2_fmadd((poly2 *)auStack_178,(poly2 *)(g.v + 10),cVar2);
    poly2_rshift1((poly2 *)auStack_178);
    poly2_cswap((poly2 *)(r.v + 10),(poly2 *)(f.v + 10),mask_00);
    poly2_fmadd((poly2 *)(f.v + 10),(poly2 *)(r.v + 10),cVar2);
  }
  if (i._4_4_ == 0) {
    if ((g.v[10] & 1) != 0) {
      poly2_reverse_700((poly2 *)(r.v + 10),(poly2 *)(r.v + 10));
      poly_from_poly2(out,(poly2 *)(r.v + 10));
      poly_assert_normalized(out);
      return;
    }
    __assert_fail("f.v[0] & 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                  ,0x5f4,"void poly_invert_mod2(struct poly *, const struct poly *)");
  }
  __assert_fail("delta == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                ,0x5f3,"void poly_invert_mod2(struct poly *, const struct poly *)");
}

Assistant:

static void poly_invert_mod2(struct poly *out, const struct poly *in) {
  // This algorithm is taken from section 7.1 of [SAFEGCD].
  struct poly2 v, r, f, g;

  // v = 0
  poly2_zero(&v);
  // r = 1
  poly2_zero(&r);
  r.v[0] = 1;
  // f = all ones.
  OPENSSL_memset(&f, 0xff, sizeof(struct poly2));
  f.v[WORDS_PER_POLY - 1] >>= BITS_PER_WORD - BITS_IN_LAST_WORD;
  // g is the reversal of |in|.
  poly2_from_poly(&g, in);
  poly2_mod_phiN(&g);
  poly2_reverse_700(&g, &g);
  int delta = 1;

  for (size_t i = 0; i < (2 * (N - 1)) - 1; i++) {
    poly2_lshift1(&v);

    const crypto_word_t delta_sign_bit = (delta >> (sizeof(delta) * 8 - 1)) & 1;
    const crypto_word_t delta_is_non_negative = delta_sign_bit - 1;
    const crypto_word_t delta_is_non_zero = ~constant_time_is_zero_w(delta);
    const crypto_word_t g_has_constant_term = lsb_to_all(g.v[0]);
    const crypto_word_t mask =
        g_has_constant_term & delta_is_non_negative & delta_is_non_zero;

    const crypto_word_t c = lsb_to_all(f.v[0] & g.v[0]);

    delta = constant_time_select_int(mask, -delta, delta);
    delta++;

    poly2_cswap(&f, &g, mask);
    poly2_fmadd(&g, &f, c);
    poly2_rshift1(&g);

    poly2_cswap(&v, &r, mask);
    poly2_fmadd(&r, &v, c);
  }

  assert(delta == 0);
  assert(f.v[0] & 1);
  poly2_reverse_700(&v, &v);
  poly_from_poly2(out, &v);
  poly_assert_normalized(out);
}